

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

int slang::ast::AssertionExpr::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  SyntaxKind SVar1;
  long lVar2;
  undefined8 uVar3;
  ulong uVar4;
  int iVar5;
  AssertionExpr *pAVar6;
  undefined4 extraout_var;
  undefined4 in_register_00000014;
  undefined4 in_register_0000003c;
  FirstMatchSequenceExprSyntax *syntax;
  ASTContext ctx;
  undefined1 local_48 [48];
  AssertionInstanceDetails *local_18;
  
  syntax = (FirstMatchSequenceExprSyntax *)CONCAT44(in_register_0000003c,__fd);
  local_48._0_8_ = *(undefined8 *)__addr;
  local_48._8_8_ = *(undefined8 *)(__addr->sa_data + 6);
  uVar4._0_2_ = __addr[1].sa_family;
  uVar4._2_1_ = __addr[1].sa_data[0];
  uVar4._3_1_ = __addr[1].sa_data[1];
  uVar4._4_1_ = __addr[1].sa_data[2];
  uVar4._5_1_ = __addr[1].sa_data[3];
  uVar4._6_1_ = __addr[1].sa_data[4];
  uVar4._7_1_ = __addr[1].sa_data[5];
  local_48._24_8_ = *(undefined8 *)(__addr[1].sa_data + 6);
  local_48._32_8_ = *(undefined8 *)(__addr + 2);
  local_48._40_8_ = *(undefined8 *)(__addr[2].sa_data + 6);
  local_18 = *(AssertionInstanceDetails **)(__addr + 3);
  local_48._16_8_ = uVar4 | 0x10;
  SVar1 = (syntax->super_SequenceExprSyntax).super_SyntaxNode.kind;
  if (SVar1 != AndSequenceExpr) {
    if (SVar1 == ClockingSequenceExpr) {
      pAVar6 = ClockingAssertionExpr::fromSyntax
                         ((ClockingSequenceExprSyntax *)syntax,(ASTContext *)local_48);
      goto LAB_0031f1aa;
    }
    if (SVar1 == DelayedSequenceExpr) {
      pAVar6 = SequenceConcatExpr::fromSyntax
                         ((SequenceConcatExpr *)syntax,(DelayedSequenceExprSyntax *)local_48,
                          (ASTContext *)CONCAT44(in_register_00000014,__len));
      goto LAB_0031f1aa;
    }
    if (SVar1 == FirstMatchSequenceExpr) {
      pAVar6 = FirstMatchAssertionExpr::fromSyntax(syntax,(ASTContext *)local_48);
      goto LAB_0031f1aa;
    }
    if ((SVar1 != IntersectSequenceExpr) && (SVar1 != OrSequenceExpr)) {
      if (SVar1 == ParenthesizedSequenceExpr) {
        lVar2._0_2_ = (syntax->closeParen).kind;
        lVar2._2_1_ = (syntax->closeParen).field_0x2;
        lVar2._3_1_ = (syntax->closeParen).numFlags;
        lVar2._4_4_ = (syntax->closeParen).rawLen;
        if (lVar2 == 0 && (syntax->openParen).info == (Info *)0x0) {
          uVar3._0_2_ = (syntax->openParen).kind;
          uVar3._2_1_ = (syntax->openParen).field_0x2;
          uVar3._3_1_ = (syntax->openParen).numFlags;
          uVar3._4_4_ = (syntax->openParen).rawLen;
          iVar5 = bind((int)uVar3,__addr,0);
          pAVar6 = (AssertionExpr *)CONCAT44(extraout_var,iVar5);
        }
        else {
          pAVar6 = SequenceWithMatchExpr::fromSyntax
                             ((ParenthesizedSequenceExprSyntax *)syntax,(ASTContext *)local_48);
        }
        goto LAB_0031f1aa;
      }
      if (SVar1 == SignalEventExpression) {
        pAVar6 = ClockingAssertionExpr::fromSyntax
                           ((SignalEventExpressionSyntax *)syntax,(ASTContext *)local_48);
        goto LAB_0031f1aa;
      }
      if ((SVar1 != WithinSequenceExpr) && (SVar1 != ThroughoutSequenceExpr)) {
        pAVar6 = SimpleAssertionExpr::fromSyntax
                           ((SimpleSequenceExprSyntax *)syntax,(ASTContext *)local_48,SUB41(__len,0)
                           );
        goto LAB_0031f1aa;
      }
    }
  }
  pAVar6 = BinaryAssertionExpr::fromSyntax
                     ((BinarySequenceExprSyntax *)syntax,(ASTContext *)local_48);
LAB_0031f1aa:
  pAVar6->syntax = (SyntaxNode *)syntax;
  return (int)pAVar6;
}

Assistant:

const AssertionExpr& AssertionExpr::bind(const SequenceExprSyntax& syntax,
                                         const ASTContext& context, bool allowDisable) {
    ASTContext ctx(context);
    ctx.flags |= ASTFlags::AssignmentDisallowed;

    AssertionExpr* result;
    switch (syntax.kind) {
        case SyntaxKind::SimpleSequenceExpr:
            result = &SimpleAssertionExpr::fromSyntax(syntax.as<SimpleSequenceExprSyntax>(), ctx,
                                                      allowDisable);
            break;
        case SyntaxKind::DelayedSequenceExpr:
            result = &SequenceConcatExpr::fromSyntax(syntax.as<DelayedSequenceExprSyntax>(), ctx);
            break;
        case SyntaxKind::AndSequenceExpr:
        case SyntaxKind::OrSequenceExpr:
        case SyntaxKind::IntersectSequenceExpr:
        case SyntaxKind::ThroughoutSequenceExpr:
        case SyntaxKind::WithinSequenceExpr:
            result = &BinaryAssertionExpr::fromSyntax(syntax.as<BinarySequenceExprSyntax>(), ctx);
            break;
        case SyntaxKind::ParenthesizedSequenceExpr: {
            auto& pse = syntax.as<ParenthesizedSequenceExprSyntax>();
            if (pse.matchList || pse.repetition)
                result = &SequenceWithMatchExpr::fromSyntax(pse, ctx);
            else
                result = const_cast<AssertionExpr*>(&bind(*pse.expr, context));
            break;
        }
        case SyntaxKind::FirstMatchSequenceExpr:
            result = &FirstMatchAssertionExpr::fromSyntax(syntax.as<FirstMatchSequenceExprSyntax>(),
                                                          ctx);
            break;
        case SyntaxKind::ClockingSequenceExpr:
            result = &ClockingAssertionExpr::fromSyntax(syntax.as<ClockingSequenceExprSyntax>(),
                                                        ctx);
            break;
        case SyntaxKind::SignalEventExpression:
            result = &ClockingAssertionExpr::fromSyntax(syntax.as<SignalEventExpressionSyntax>(),
                                                        ctx);
            break;
        default:
            SLANG_UNREACHABLE;
    }

    result->syntax = &syntax;
    return *result;
}